

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  string *psVar1;
  string *psVar2;
  undefined1 *this_00;
  cmCTest *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  pointer pcVar11;
  pointer pbVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  int retVal;
  cmXMLWriter xml;
  char *local_6c0 [4];
  double local_6a0;
  string srcdirrep;
  cmGeneratedFileStream xofs;
  string local_2d8;
  string makeCommand;
  string local_298;
  cmGeneratedFileStream ofs;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
  poVar8 = std::operator<<((ostream *)&ofs,"Build project");
  std::endl<char,std::char_traits<char>>(poVar8);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x13c,(char *)xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                              ._vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&xofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  dVar14 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar7 = 0;
  if (120.0 <= dVar14) {
    this_00 = &xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    for (lVar9 = 8; lVar9 != 0x78; lVar9 = lVar9 + 0x10) {
      pcVar10 = *(char **)((long)&PTR_Initialize_006830a8 + lVar9);
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._192_8_ = 0;
      bVar5 = cmsys::RegularExpression::compile((RegularExpression *)this_00,pcVar10);
      if (bVar5) {
        xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             *(_func_int ***)((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar9)
        ;
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)&xofs);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar8 = std::operator<<((ostream *)&ofs,"Problem Compiling regular expression: ");
        poVar8 = std::operator<<(poVar8,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x156,srcdirrep._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)this_00);
    }
    GetMakeCommand_abi_cxx11_(&makeCommand,this);
    if (makeCommand._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
      poVar8 = std::operator<<((ostream *)&ofs,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x160,(char *)xofs.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,false);
      std::__cxx11::string::~string((string *)&xofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      iVar7 = -1;
    }
    else {
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string((string *)&ofs,"BuildDirectory",(allocator *)&xofs);
      cmCTest::GetCTestConfiguration(&local_2d8,pcVar3,(string *)&ofs);
      std::__cxx11::string::~string((string *)&ofs);
      if (local_2d8._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar8 = std::operator<<((ostream *)&ofs,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x16a,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
        iVar7 = -1;
      }
      else {
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string((string *)&ofs,"UseLaunchers",(allocator *)&xofs);
        cmCTest::GetCTestConfiguration(&local_298,pcVar3,(string *)&ofs);
        std::__cxx11::string::~string((string *)&ofs);
        bVar5 = cmSystemTools::IsOn(local_298._M_dataplus._M_p);
        this->UseCTestLaunch = bVar5;
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs);
        dVar14 = cmsys::SystemTools::GetTime();
        bVar5 = cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Build",&ofs)
        ;
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Cannot create build log file");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x178,srcdirrep._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        }
        for (lVar9 = 0; lVar9 != 0x1b8; lVar9 = lVar9 + 8) {
          std::__cxx11::string::string
                    ((string *)&xofs,*(char **)((long)cmCTestErrorMatches + lVar9),
                     (allocator *)&srcdirrep);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs);
          std::__cxx11::string::~string((string *)&xofs);
        }
        for (lVar9 = 0; lVar9 != 0x50; lVar9 = lVar9 + 8) {
          std::__cxx11::string::string
                    ((string *)&xofs,*(char **)((long)cmCTestErrorExceptions + lVar9),
                     (allocator *)&srcdirrep);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs);
          std::__cxx11::string::~string((string *)&xofs);
        }
        for (lVar9 = 0; lVar9 != 0xa8; lVar9 = lVar9 + 8) {
          std::__cxx11::string::string
                    ((string *)&xofs,*(char **)((long)cmCTestWarningMatches + lVar9),
                     (allocator *)&srcdirrep);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs);
          std::__cxx11::string::~string((string *)&xofs);
        }
        for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 8) {
          std::__cxx11::string::string
                    ((string *)&xofs,*(char **)((long)cmCTestWarningExceptions + lVar9),
                     (allocator *)&srcdirrep);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs);
          std::__cxx11::string::~string((string *)&xofs);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->ErrorMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x19e,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        for (pbVar12 = (this->CustomErrorMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            (this->CustomErrorMatches).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorMatches: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x19e,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)&xofs,(pbVar12->_M_dataplus)._M_p);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>(&this->ErrorMatchRegex,(RegularExpression *)&xofs);
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)&xofs);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->ErrorExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a0,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        for (pbVar12 = (this->CustomErrorExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            (this->CustomErrorExceptions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorExceptions: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a0,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)&xofs,(pbVar12->_M_dataplus)._M_p);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>
                    (&this->ErrorExceptionRegex,(RegularExpression *)&xofs);
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)&xofs);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->WarningMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a2,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        for (pbVar12 = (this->CustomWarningMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            (this->CustomWarningMatches).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningMatches: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a2,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)&xofs,(pbVar12->_M_dataplus)._M_p);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>
                    (&this->WarningMatchRegex,(RegularExpression *)&xofs);
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)&xofs);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->WarningExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a4,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&srcdirrep);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        for (pbVar12 = (this->CustomWarningExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            (this->CustomWarningExceptions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningExceptions: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1a4,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)&xofs,(pbVar12->_M_dataplus)._M_p);
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>
                    (&this->WarningExceptionRegex,(RegularExpression *)&xofs);
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)&xofs);
        }
        psVar1 = &this->SimplifySourceDir;
        std::__cxx11::string::assign((char *)psVar1);
        psVar2 = &this->SimplifyBuildDir;
        std::__cxx11::string::assign((char *)psVar2);
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string((string *)&srcdirrep,"SourceDirectory",(allocator *)&xml);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar3,&srcdirrep);
        uVar4 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&srcdirrep);
        if (0x14 < (ulong)uVar4) {
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string((string *)&xml,"SourceDirectory",(allocator *)local_6c0);
          cmCTest::GetCTestConfiguration(&srcdirrep,pcVar3,(string *)&xml);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         &srcdirrep,"/");
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xml);
          srcdirrep._M_dataplus._M_p = (pointer)&srcdirrep.field_2;
          srcdirrep._M_string_length = 0;
          srcdirrep.field_2._M_local_buf[0] = '\0';
          pcVar10 = (char *)((long)xofs.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream +
                            xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _8_8_ + -2);
          lVar9 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
          while (lVar9 = lVar9 + -1, lVar9 != 1) {
            if (*pcVar10 == '/') {
              std::__cxx11::string::assign((char *)&srcdirrep);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &xml,"/...",&srcdirrep);
              std::__cxx11::string::operator=((string *)&srcdirrep,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              std::__cxx11::string::substr((ulong)&xml,(ulong)&xofs);
              std::__cxx11::string::operator=((string *)&xofs,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              break;
            }
            pcVar10 = pcVar10 + -1;
          }
          std::__cxx11::string::_M_assign((string *)psVar1);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xofs);
        }
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string((string *)&srcdirrep,"BuildDirectory",(allocator *)&xml);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar3,&srcdirrep);
        uVar4 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&srcdirrep);
        if (0x14 < (ulong)uVar4) {
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string((string *)&xml,"BuildDirectory",(allocator *)local_6c0);
          cmCTest::GetCTestConfiguration(&srcdirrep,pcVar3,(string *)&xml);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         &srcdirrep,"/");
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xml);
          srcdirrep._M_dataplus._M_p = (pointer)&srcdirrep.field_2;
          srcdirrep._M_string_length = 0;
          srcdirrep.field_2._M_local_buf[0] = '\0';
          pcVar10 = (char *)((long)xofs.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream +
                            xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _8_8_ + -2);
          while (xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
                      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                      -1, xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _8_8_ != 1) {
            if (*pcVar10 == '/') {
              std::__cxx11::string::assign((char *)&srcdirrep);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &xml,"/...",&srcdirrep);
              std::__cxx11::string::operator=((string *)&srcdirrep,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              std::__cxx11::string::substr((ulong)&xml,(ulong)&xofs);
              std::__cxx11::string::operator=((string *)&xofs,(string *)&xml);
              std::__cxx11::string::~string((string *)&xml);
              break;
            }
            pcVar10 = pcVar10 + -1;
          }
          std::__cxx11::string::_M_assign((string *)psVar2);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::string::~string((string *)&xofs);
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        dVar15 = cmsys::SystemTools::GetTime();
        this->StartBuildTime = dVar15;
        retVal = 0;
        bVar5 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Build with command: ");
          poVar8 = std::operator<<(poVar8,(string *)&makeCommand);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1dd,srcdirrep._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&srcdirrep);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          bVar5 = false;
        }
        else {
          iVar7 = RunMakeCommand(this,makeCommand._M_dataplus._M_p,&retVal,
                                 local_2d8._M_dataplus._M_p,0,(ostream *)&ofs);
          bVar5 = iVar7 != 4;
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        dVar15 = cmsys::SystemTools::GetTime();
        this->EndBuildTime = dVar15;
        local_6a0 = cmsys::SystemTools::GetTime();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          for (pcVar11 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pcVar11 !=
              (this->ErrorsAndWarnings).
              super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
              ._M_impl.super__Vector_impl_data._M_finish; pcVar11 = pcVar11 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar11->Text,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar11->PreContext,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar11->PostContext,(psVar1->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          for (pcVar11 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pcVar11 !=
              (this->ErrorsAndWarnings).
              super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
              ._M_impl.super__Vector_impl_data._M_finish; pcVar11 = pcVar11 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar11->Text,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar11->PreContext,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar11->PostContext,(psVar2->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream(&xofs);
        bVar6 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",&xofs);
        if (bVar6) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xofs,0);
          GenerateXMLHeader(this,&xml);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,&xml);
          }
          else {
            GenerateXMLLogScraped(this,&xml);
          }
          GenerateXMLFooter(this,&xml,local_6a0 - dVar14);
          if ((bVar5 || retVal != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
            poVar8 = std::operator<<((ostream *)&srcdirrep,"Error(s) when building project");
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x21c,local_6c0[0],false);
            std::__cxx11::string::~string((string *)local_6c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar8 = std::operator<<((ostream *)&srcdirrep,"   ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->TotalErrors);
          pcVar13 = " or more";
          pcVar10 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar10 = "";
          }
          poVar8 = std::operator<<(poVar8,pcVar10);
          poVar8 = std::operator<<(poVar8," Compiler errors");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x222,local_6c0[0],false);
          std::__cxx11::string::~string((string *)local_6c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar8 = std::operator<<((ostream *)&srcdirrep,"   ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar13 = "";
          }
          poVar8 = std::operator<<(poVar8,pcVar13);
          poVar8 = std::operator<<(poVar8," Compiler warnings");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x225,local_6c0[0],false);
          std::__cxx11::string::~string((string *)local_6c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          iVar7 = retVal;
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&srcdirrep);
          poVar8 = std::operator<<((ostream *)&srcdirrep,"Cannot create build XML file");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x20a,(char *)xml.Output,false);
          std::__cxx11::string::~string((string *)&xml);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&srcdirrep);
          iVar7 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&xofs);
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&local_298);
      }
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    std::__cxx11::string::~string((string *)&makeCommand);
  }
  return iVar7;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
    this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < 120)
    {
    return 0;
    }

  int entry;
  for ( entry = 0;
    cmCTestWarningErrorFileLine[entry].RegularExpressionString;
    ++ entry )
    {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if ( r.RegularExpression.compile(
        cmCTestWarningErrorFileLine[entry].RegularExpressionString) )
      {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(r);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
       << cmCTestWarningErrorFileLine[entry].RegularExpressionString
       << std::endl);
      }
    }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find MakeCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  const std::string &buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers.c_str());

  // Create a last build log
  cmGeneratedFileStream ofs;
  double elapsed_time_start = cmSystemTools::GetTime();
  if ( !this->StartLogFile("Build", ofs) )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build log file"
      << std::endl);
    }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for ( cc = 0; cmCTestErrorMatches[cc]; cc ++ )
    {
    this->CustomErrorMatches.push_back(cmCTestErrorMatches[cc]);
    }
  for ( cc = 0; cmCTestErrorExceptions[cc]; cc ++ )
    {
    this->CustomErrorExceptions.push_back(cmCTestErrorExceptions[cc]);
    }
  for ( cc = 0; cmCTestWarningMatches[cc]; cc ++ )
    {
    this->CustomWarningMatches.push_back(cmCTestWarningMatches[cc]);
    }

  for ( cc = 0; cmCTestWarningExceptions[cc]; cc ++ )
    {
    this->CustomWarningExceptions.push_back(cmCTestWarningExceptions[cc]);
    }

  // Pre-compile regular expressions objects for all regular expressions
  std::vector<std::string>::iterator it;

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes) \
  regexes.clear(); \
    cmCTestOptionalLog(this->CTest, DEBUG, this << "Add " #regexes \
    << std::endl, this->Quiet); \
  for ( it = strings.begin(); it != strings.end(); ++it ) \
    { \
    cmCTestOptionalLog(this->CTest, DEBUG, "Add " #strings ": " \
    << *it << std::endl, this->Quiet); \
    regexes.push_back(it->c_str()); \
    }
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorMatches, this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorExceptions, this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningMatches, this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningExceptions, this->WarningExceptionRegex);


  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir = "";
  this->SimplifyBuildDir = "";
  if ( this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20 )
    {
    std::string srcdir
      = this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for ( cc = srcdir.size()-2; cc > 0; cc -- )
      {
      if ( srcdir[cc] == '/' )
        {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifySourceDir = srcdir;
    }
  if ( this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20 )
    {
    std::string bindir
      = this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for ( cc = bindir.size()-2; cc > 0; cc -- )
      {
      if ( bindir[cc] == '/' )
        {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifyBuildDir = bindir;
    }


  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = cmSystemTools::GetTime();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if ( !this->CTest->GetShowOnly() )
    {
    res = this->RunMakeCommand(makeCommand.c_str(), &retVal,
      buildDirectory.c_str(), 0, ofs);
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG, "Build with command: " <<
      makeCommand << std::endl, this->Quiet);
    }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = cmSystemTools::GetTime();
  double elapsed_build_time = cmSystemTools::GetTime() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  t_ErrorsAndWarningsVector::iterator evit;
  if ( !this->SimplifySourceDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifySourceDir.c_str(), "/.../");
      }
    }

  if ( !this->SimplifyBuildDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifyBuildDir.c_str(), "/.../");
      }
    }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if(!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build XML file"
      << std::endl);
    return -1;
    }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if(this->UseCTestLaunch)
    {
    this->GenerateXMLLaunched(xml);
    }
  else
    {
    this->GenerateXMLLogScraped(xml);
    }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error(s) when building project"
      << std::endl);
    }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalErrors
    << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
    << " Compiler errors" << std::endl);
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalWarnings
    << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
    << " Compiler warnings" << std::endl);

  return retVal;
}